

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O0

void repeat_cb(uv_timer_t *handle)

{
  int iVar1;
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  uv_timer_t *handle_local;
  
  printf("REPEAT_CB\n");
  if (handle == (uv_timer_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
            ,99,"handle","!=","NULL",0,"!=",0);
    abort();
  }
  iVar1 = uv_is_active((uv_handle_t *)handle);
  if ((long)iVar1 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
            ,100,"1","==","uv_is_active((uv_handle_t*) handle)",1,"==",(long)iVar1);
    abort();
  }
  repeat_cb_called = repeat_cb_called + 1;
  if (repeat_cb_called == 5) {
    uv_close((uv_handle_t *)handle,repeat_close_cb);
  }
  return;
}

Assistant:

static void repeat_cb(uv_timer_t* handle) {
  printf("REPEAT_CB\n");

  ASSERT_NOT_NULL(handle);
  ASSERT_EQ(1, uv_is_active((uv_handle_t*) handle));

  repeat_cb_called++;

  if (repeat_cb_called == 5) {
    uv_close((uv_handle_t*)handle, repeat_close_cb);
  }
}